

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O2

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::new_infinite_barcode
          (barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,value_t birth)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)
                           &(this->
                            super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                            ).outstream," [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,birth);
  poVar1 = std::operator<<(poVar1,", )");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

inline void new_infinite_barcode(value_t birth) {
		file_output_t<Complex>::outstream << " [" << birth << ", )" << std::endl;
	}